

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# array.h
# Opt level: O2

int __thiscall
array<CSkins::CSkin,_allocator_default<CSkins::CSkin>_>::insert
          (array<CSkins::CSkin,_allocator_default<CSkins::CSkin>_> *this,CSkin *item,range r)

{
  CSkin *pCVar1;
  int iVar2;
  CSkin *pCVar3;
  long lVar4;
  char *__dest;
  long lVar5;
  long in_FS_OFFSET;
  plain_range<CSkins::CSkin> local_48;
  long local_38;
  
  local_48.end = r.end;
  local_48.begin = r.begin;
  local_38 = *(long *)(in_FS_OFFSET + 0x28);
  if (local_48.begin < local_48.end) {
    pCVar3 = plain_range<CSkins::CSkin>::front(&local_48);
    pCVar1 = this->list;
    incsize(this);
    set_size(this,this->num_elements + 1);
    lVar5 = (long)this->num_elements;
    iVar2 = (int)(((long)pCVar3 - (long)pCVar1) / 200);
    lVar4 = lVar5 * 200;
    while( true ) {
      lVar5 = lVar5 + -1;
      if (lVar5 <= iVar2) break;
      __dest = this->list[-1].m_aName + lVar4 + -4;
      memcpy(__dest,__dest + -200,200);
      lVar4 = lVar4 + -200;
    }
    memcpy(this->list + iVar2,item,200);
    if (*(long *)(in_FS_OFFSET + 0x28) == local_38) {
      return this->num_elements + -1;
    }
  }
  else if (*(long *)(in_FS_OFFSET + 0x28) == local_38) {
    iVar2 = add(this,item);
    return iVar2;
  }
  __stack_chk_fail();
}

Assistant:

int insert(const T& item, range r)
	{
		if(r.empty())
			return add(item);

		int index = (int)(&r.front()-list);
		incsize();
		set_size(size()+1);

		for(int i = num_elements-1; i > index; i--)
			list[i] = list[i-1];

		list[index] = item;

		return num_elements-1;
	}